

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

void __thiscall FCompressedFile::FCompressedFile(FCompressedFile *this)

{
  FCompressedFile *this_local;
  
  FFile::FFile(&this->super_FFile);
  (this->super_FFile)._vptr_FFile = (_func_int **)&PTR__FCompressedFile_00b6bc28;
  BeEmpty(this);
  return;
}

Assistant:

FCompressedFile::FCompressedFile ()
{
	BeEmpty ();
}